

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterTest::iterate(AtomicCounterTest *this)

{
  BindingType BVar1;
  OffsetType OVar2;
  char cVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  ProgramSources *sources;
  void *pvVar7;
  MessageBuilder *this_00;
  TestError *pTVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  AtomicCounterTest *pAVar17;
  int counterNdx_1;
  int iVar18;
  qpTestResult testResult;
  Operation OVar19;
  char *pcVar20;
  TestLog *pTVar21;
  uint uVar22;
  uint uVar23;
  ScopedLogSection *this_01;
  ulong uVar24;
  pointer puVar25;
  int counterNdx;
  uint uVar26;
  long lVar27;
  int counterNdx_2;
  int iVar28;
  pointer *ppuVar29;
  long lVar30;
  bool bVar31;
  int local_65c;
  AtomicCounterTest *local_658;
  ulong local_650;
  byte local_641;
  TestLog *local_640;
  allocator<char> local_632;
  allocator<char> local_631;
  RenderContext *local_630;
  undefined4 local_624;
  ScopedLogSection uniquenesCheck_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  string local_5f8;
  string local_5d8;
  ScopedLogSection valueCheck;
  ScopedLogSection counterSection;
  string local_590 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  vector<unsigned_int,_std::allocator<unsigned_int>_> output;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterDecrements;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterIncrements;
  string local_4f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> gets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counters;
  string local_4a8;
  string local_488;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterPostGets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterPreGets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> postGets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> preGets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> decrements;
  vector<unsigned_int,_std::allocator<unsigned_int>_> increments;
  Buffer outputBuffer;
  Buffer counterBuffer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterGets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> decrementCounts;
  ShaderProgram program;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_650 = CONCAT44(extraout_var,iVar4);
  pTVar21 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&counterBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&outputBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  local_630 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&decrementCounts,0,0xac);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&data);
  poVar6 = std::operator<<((ostream *)&data,"#version 310 es\n");
  std::operator<<(poVar6,"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  BVar1 = (this->m_spec).bindingType;
  if (BVar1 == BINDINGTYPE_INVALID_DEFAULT) {
    std::operator<<((ostream *)&data,"layout(binding=10000");
  }
  OVar2 = (this->m_spec).offsetType;
  pcVar20 = "layout(binding=1, ";
  if (OVar2 == OFFSETTYPE_INVALID_DEFAULT) {
    if (BVar1 == BINDINGTYPE_INVALID_DEFAULT) {
      pcVar20 = ", ";
    }
    std::operator<<((ostream *)&data,pcVar20);
    pcVar20 = "offset=1";
LAB_0042a4dd:
    std::operator<<((ostream *)&data,pcVar20);
LAB_0042a4f1:
    std::operator<<((ostream *)&data,") uniform atomic_uint;\n");
  }
  else {
    if (OVar2 == OFFSETTYPE_RESET_DEFAULT) {
      if (BVar1 == BINDINGTYPE_INVALID_DEFAULT) {
        pcVar20 = ", ";
      }
      std::operator<<((ostream *)&data,pcVar20);
      poVar6 = std::operator<<((ostream *)&data,"offset=");
      std::ostream::operator<<(poVar6,((this->m_spec).atomicCounterCount << 2) >> 1);
      goto LAB_0042a4f1;
    }
    if (OVar2 == OFFSETTYPE_DEFAULT_AUTO) {
      if (BVar1 == BINDINGTYPE_INVALID_DEFAULT) {
        pcVar20 = ", ";
      }
      std::operator<<((ostream *)&data,pcVar20);
      pcVar20 = "offset=4";
      goto LAB_0042a4dd;
    }
    if (BVar1 == BINDINGTYPE_INVALID_DEFAULT) goto LAB_0042a4f1;
  }
  std::operator<<((ostream *)&data,"layout(binding = 1, std430) buffer Output {\n");
  OVar19 = (this->m_spec).operations;
  if (OVar19 != OPERATION_GET && (OVar19 & OPERATION_GET) != 0) {
    poVar6 = std::operator<<((ostream *)&data,"\tuint preGet[");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->m_spec).atomicCounterCount * (this->m_spec).threadCount *
                               (this->m_spec).callCount);
    std::operator<<(poVar6,"];\n");
    OVar19 = (this->m_spec).operations;
  }
  if ((OVar19 & OPERATION_INC) != 0) {
    poVar6 = std::operator<<((ostream *)&data,"\tuint increment[");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->m_spec).atomicCounterCount * (this->m_spec).threadCount *
                               (this->m_spec).callCount);
    std::operator<<(poVar6,"];\n");
    OVar19 = (this->m_spec).operations;
  }
  if ((OVar19 & OPERATION_DEC) != 0) {
    poVar6 = std::operator<<((ostream *)&data,"\tuint decrement[");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->m_spec).atomicCounterCount * (this->m_spec).threadCount *
                               (this->m_spec).callCount);
    std::operator<<(poVar6,"];\n");
    OVar19 = (this->m_spec).operations;
  }
  if (OVar19 != OPERATION_GET && (OVar19 & OPERATION_GET) != 0) {
    poVar6 = std::operator<<((ostream *)&data,"\tuint postGet[");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->m_spec).atomicCounterCount * (this->m_spec).threadCount *
                               (this->m_spec).callCount);
    std::operator<<(poVar6,"];\n");
    OVar19 = (this->m_spec).operations;
  }
  if (OVar19 == OPERATION_GET) {
    poVar6 = std::operator<<((ostream *)&data,"\tuint get[");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->m_spec).atomicCounterCount * (this->m_spec).threadCount *
                               (this->m_spec).callCount);
    std::operator<<(poVar6,"];\n");
  }
  std::operator<<((ostream *)&data,"} sb_in;\n\n");
  iVar18 = 0;
  iVar4 = -1;
  local_658 = this;
  local_640 = pTVar21;
  for (uVar26 = 0; pAVar17 = local_658, iVar12 = (local_658->m_spec).atomicCounterCount,
      (int)uVar26 < iVar12; uVar26 = uVar26 + 1) {
    if ((uVar26 == iVar12 / 2) && ((local_658->m_spec).offsetType == OFFSETTYPE_RESET_DEFAULT)) {
      std::operator<<((ostream *)&data,"layout(binding=1, offset=0) uniform atomic_uint;\n");
    }
    BVar1 = (local_658->m_spec).bindingType;
    pcVar20 = "layout(binding=1";
    if (BVar1 == BINDINGTYPE_BASIC) {
LAB_0042a714:
      bVar31 = true;
      std::operator<<((ostream *)&data,pcVar20);
    }
    else {
      if (BVar1 == BINDINGTYPE_INVALID) {
        pcVar20 = "layout(binding=10000";
        goto LAB_0042a714;
      }
      bVar31 = false;
    }
    poVar6 = (ostream *)&data;
    switch((local_658->m_spec).offsetType) {
    case OFFSETTYPE_NONE:
    case OFFSETTYPE_INVALID_DEFAULT:
      pcVar20 = "uniform atomic_uint counter";
      if (bVar31) {
        std::operator<<((ostream *)&data,") ");
        pcVar20 = "uniform atomic_uint counter";
      }
      goto LAB_0042a948;
    case OFFSETTYPE_BASIC:
      pcVar20 = "layout(";
      if (bVar31) {
        pcVar20 = ", ";
      }
      std::operator<<((ostream *)&data,pcVar20);
      poVar6 = std::operator<<((ostream *)&data,"offset=");
      iVar12 = iVar18;
      goto LAB_0042a910;
    case OFFSETTYPE_REVERSE:
      pcVar20 = "layout(";
      if (bVar31) {
        pcVar20 = ", ";
      }
      std::operator<<((ostream *)&data,pcVar20);
      poVar6 = std::operator<<((ostream *)&data,"offset=");
      poVar6 = (ostream *)
               std::ostream::operator<<(poVar6,((local_658->m_spec).atomicCounterCount + iVar4) * 4)
      ;
      poVar6 = std::operator<<(poVar6,") uniform atomic_uint counter");
      uVar9 = ~uVar26 + (local_658->m_spec).atomicCounterCount;
      break;
    case OFFSETTYPE_FIRST_AUTO:
      if (uVar26 + 1 == (local_658->m_spec).atomicCounterCount) {
LAB_0042a81a:
        pcVar20 = "layout(";
        if (bVar31) {
          pcVar20 = ", ";
        }
        std::operator<<((ostream *)&data,pcVar20);
        pcVar20 = "offset=0) uniform atomic_uint counter0;\n";
      }
      else {
        if (uVar26 != 0) {
          if (bVar31) {
            std::operator<<((ostream *)&data,") ");
          }
          poVar6 = std::operator<<((ostream *)&data,"uniform atomic_uint counter");
          goto LAB_0042a9a2;
        }
        pcVar20 = "layout(";
        if (bVar31) {
          pcVar20 = ", ";
        }
        std::operator<<((ostream *)&data,pcVar20);
        pcVar20 = "offset=4) uniform atomic_uint counter1;\n";
      }
      goto LAB_0042a964;
    case OFFSETTYPE_DEFAULT_AUTO:
      if (uVar26 + 1 == (local_658->m_spec).atomicCounterCount) goto LAB_0042a81a;
      if (bVar31) {
        std::operator<<((ostream *)&data,") ");
      }
      poVar6 = std::operator<<((ostream *)&data,"uniform atomic_uint counter");
LAB_0042a9a2:
      uVar9 = uVar26 + 1;
      break;
    case OFFSETTYPE_RESET_DEFAULT:
      if (bVar31) {
        std::operator<<((ostream *)&data,") ");
      }
      if ((int)uVar26 < (local_658->m_spec).atomicCounterCount / 2) {
        poVar6 = std::operator<<((ostream *)&data,"uniform atomic_uint counter");
        iVar12 = (local_658->m_spec).atomicCounterCount;
        iVar28 = 2;
      }
      else {
        poVar6 = std::operator<<((ostream *)&data,"uniform atomic_uint counter");
        iVar12 = (local_658->m_spec).atomicCounterCount;
        iVar28 = -2;
      }
      uVar9 = iVar12 / iVar28 + uVar26;
      break;
    case OFFSETTYPE_INVALID:
      pcVar20 = "layout(";
      if (bVar31) {
        pcVar20 = ", ";
      }
      std::operator<<((ostream *)&data,pcVar20);
      poVar6 = std::operator<<((ostream *)&data,"offset=");
      iVar12 = uVar26 * 2 + 1;
LAB_0042a910:
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar12);
      pcVar20 = ") uniform atomic_uint counter";
      goto LAB_0042a948;
    case OFFSETTYPE_INVALID_OVERLAPPING:
      pcVar20 = "layout(";
      if (bVar31) {
        pcVar20 = ", ";
      }
      std::operator<<((ostream *)&data,pcVar20);
      pcVar20 = "offset=0) uniform atomic_uint counter";
LAB_0042a948:
      poVar6 = std::operator<<(poVar6,pcVar20);
      uVar9 = uVar26;
      break;
    default:
      goto switchD_0042a747_default;
    }
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar9);
    pcVar20 = ";\n";
LAB_0042a964:
    std::operator<<(poVar6,pcVar20);
switchD_0042a747_default:
    iVar18 = iVar18 + 4;
    iVar4 = iVar4 + -1;
  }
  poVar6 = std::operator<<((ostream *)&data,"\n");
  poVar6 = std::operator<<(poVar6,"void main (void)\n");
  std::operator<<(poVar6,"{\n");
  if (1 < (pAVar17->m_spec).callCount) {
    poVar6 = std::operator<<((ostream *)&data,"\tfor (uint i = 0u; i < ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(pAVar17->m_spec).callCount);
    std::operator<<(poVar6,"u; i++)\n");
  }
  poVar6 = std::operator<<((ostream *)&data,"\t{\n");
  std::operator<<(poVar6,"\t\tuint id = (gl_GlobalInvocationID.x");
  if ((pAVar17->m_spec).callCount < 2) {
LAB_0042aada:
    pcVar20 = ")";
  }
  else {
    poVar6 = std::operator<<((ostream *)&data," * ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(pAVar17->m_spec).callCount);
    std::operator<<(poVar6,"u");
    if ((pAVar17->m_spec).callCount < 2) goto LAB_0042aada;
    pcVar20 = " + i)";
  }
  std::operator<<((ostream *)&data,pcVar20);
  if (1 < (pAVar17->m_spec).atomicCounterCount) {
    poVar6 = std::operator<<((ostream *)&data," * ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(pAVar17->m_spec).atomicCounterCount);
    std::operator<<(poVar6,"u");
  }
  std::operator<<((ostream *)&data,";\n");
  for (iVar4 = 0; pAVar17 = local_658, iVar4 < (local_658->m_spec).atomicCounterCount;
      iVar4 = iVar4 + 1) {
    OVar19 = (local_658->m_spec).operations;
    if (OVar19 != OPERATION_GET && (OVar19 & OPERATION_GET) != 0) {
      poVar6 = std::operator<<((ostream *)&data,"\t\tsb_in.preGet[id + ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
      poVar6 = std::operator<<(poVar6,"u] = atomicCounter(counter");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
      std::operator<<(poVar6,");\n");
      OVar19 = (local_658->m_spec).operations;
    }
    if ((local_658->m_spec).useBranches == true) {
      if ((~OVar19 & 3) != 0) {
        if ((OVar19 & OPERATION_INC) != 0) {
          poVar6 = std::operator<<((ostream *)&data,"\t\tif (((gl_GlobalInvocationID.x");
          pcVar20 = SSBOArrayLengthTests::init::arraysSized + 1;
          if (1 < (local_658->m_spec).callCount) {
            pcVar20 = " + i";
          }
          poVar6 = std::operator<<(poVar6,pcVar20);
          poVar6 = std::operator<<(poVar6,") % 2u) == 0u)\n");
          poVar6 = std::operator<<(poVar6,"\t\t{\n");
          poVar6 = std::operator<<(poVar6,"\t\t\tsb_in.increment[id + ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
          poVar6 = std::operator<<(poVar6,"u] = atomicCounterIncrement(counter");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
          poVar6 = std::operator<<(poVar6,");\n");
          poVar6 = std::operator<<(poVar6,"\t\t}\n");
          poVar6 = std::operator<<(poVar6,"\t\telse\n");
          poVar6 = std::operator<<(poVar6,"\t\t{\n");
          poVar6 = std::operator<<(poVar6,"\t\t\tsb_in.increment[id + ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
          poVar6 = std::operator<<(poVar6,"u] = uint(-1);\n");
          pcVar20 = "\t\t}\n";
          goto LAB_0042ae22;
        }
        goto LAB_0042ae32;
      }
      poVar6 = std::operator<<((ostream *)&data,"\t\tif (((gl_GlobalInvocationID.x");
      pcVar20 = SSBOArrayLengthTests::init::arraysSized + 1;
      if (1 < (local_658->m_spec).callCount) {
        pcVar20 = " + i";
      }
      poVar6 = std::operator<<(poVar6,pcVar20);
      poVar6 = std::operator<<(poVar6,") % 2u) == 0u)\n");
      poVar6 = std::operator<<(poVar6,"\t\t{\n");
      poVar6 = std::operator<<(poVar6,"\t\t\tsb_in.increment[id + ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
      poVar6 = std::operator<<(poVar6,"u] = atomicCounterIncrement(counter");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
      poVar6 = std::operator<<(poVar6,");\n");
      poVar6 = std::operator<<(poVar6,"\t\t\tsb_in.decrement[id + ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
      poVar6 = std::operator<<(poVar6,"u] = uint(-1);\n");
      poVar6 = std::operator<<(poVar6,"\t\t}\n");
      poVar6 = std::operator<<(poVar6,"\t\telse\n");
      poVar6 = std::operator<<(poVar6,"\t\t{\n");
      poVar6 = std::operator<<(poVar6,"\t\t\tsb_in.decrement[id + ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
      poVar6 = std::operator<<(poVar6,"u] = atomicCounterDecrement(counter");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
      poVar6 = std::operator<<(poVar6,") + 1u;\n");
      pcVar20 = "\t\t\tsb_in.increment[id + ";
LAB_0042af08:
      poVar6 = std::operator<<(poVar6,pcVar20);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
      poVar6 = std::operator<<(poVar6,"u] = uint(-1);\n");
      pcVar20 = "\t\t}\n";
LAB_0042af67:
      std::operator<<(poVar6,pcVar20);
      OVar19 = (local_658->m_spec).operations;
    }
    else {
      if ((OVar19 & OPERATION_INC) != 0) {
        poVar6 = std::operator<<((ostream *)&data,"\t\tsb_in.increment[id + ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
        poVar6 = std::operator<<(poVar6,"u] = atomicCounterIncrement(counter");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
        pcVar20 = ");\n";
LAB_0042ae22:
        std::operator<<(poVar6,pcVar20);
        OVar19 = (local_658->m_spec).operations;
      }
LAB_0042ae32:
      if ((OVar19 & OPERATION_DEC) != 0) {
        if ((local_658->m_spec).useBranches == true) {
          poVar6 = std::operator<<((ostream *)&data,"\t\tif (((gl_GlobalInvocationID.x");
          pcVar20 = SSBOArrayLengthTests::init::arraysSized + 1;
          if (1 < (local_658->m_spec).callCount) {
            pcVar20 = " + i";
          }
          poVar6 = std::operator<<(poVar6,pcVar20);
          poVar6 = std::operator<<(poVar6,") % 2u) == 0u)\n");
          poVar6 = std::operator<<(poVar6,"\t\t{\n");
          poVar6 = std::operator<<(poVar6,"\t\t\tsb_in.decrement[id + ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
          poVar6 = std::operator<<(poVar6,"u] = atomicCounterDecrement(counter");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
          poVar6 = std::operator<<(poVar6,") + 1u;\n");
          poVar6 = std::operator<<(poVar6,"\t\t}\n");
          poVar6 = std::operator<<(poVar6,"\t\telse\n");
          poVar6 = std::operator<<(poVar6,"\t\t{\n");
          pcVar20 = "\t\t\tsb_in.decrement[id + ";
          goto LAB_0042af08;
        }
        poVar6 = std::operator<<((ostream *)&data,"\t\tsb_in.decrement[id + ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
        poVar6 = std::operator<<(poVar6,"u] = atomicCounterDecrement(counter");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
        pcVar20 = ") + 1u;\n";
        goto LAB_0042af67;
      }
    }
    if (OVar19 != OPERATION_GET && (OVar19 & OPERATION_GET) != 0) {
      poVar6 = std::operator<<((ostream *)&data,"\t\tsb_in.postGet[id + ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
      poVar6 = std::operator<<(poVar6,"u] = atomicCounter(counter");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
      std::operator<<(poVar6,");\n");
      OVar19 = (local_658->m_spec).operations;
    }
    if (OVar19 == OPERATION_GET) {
      if ((local_658->m_spec).useBranches == true) {
        poVar6 = std::operator<<((ostream *)&data,"\t\tif (((gl_GlobalInvocationID.x");
        pcVar20 = SSBOArrayLengthTests::init::arraysSized + 1;
        if (1 < (local_658->m_spec).callCount) {
          pcVar20 = " + i";
        }
        poVar6 = std::operator<<(poVar6,pcVar20);
        poVar6 = std::operator<<(poVar6,") % 2u) == 0u)\n");
        poVar6 = std::operator<<(poVar6,"\t\t{\n");
        poVar6 = std::operator<<(poVar6,"\t\t\tsb_in.get[id + ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
        poVar6 = std::operator<<(poVar6,"u] = atomicCounter(counter");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
        poVar6 = std::operator<<(poVar6,");\n");
        poVar6 = std::operator<<(poVar6,"\t\t}\n");
        poVar6 = std::operator<<(poVar6,"\t\telse\n");
        poVar6 = std::operator<<(poVar6,"\t\t{\n");
        poVar6 = std::operator<<(poVar6,"\t\t\tsb_in.get[id + ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
        poVar6 = std::operator<<(poVar6,"u] = uint(-1);\n");
        pcVar20 = "\t\t}\n";
      }
      else {
        poVar6 = std::operator<<((ostream *)&data,"\t\tsb_in.get[id + ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
        poVar6 = std::operator<<(poVar6,"u] = atomicCounter(counter");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
        pcVar20 = ");\n";
      }
      std::operator<<(poVar6,pcVar20);
    }
  }
  poVar6 = std::operator<<((ostream *)&data,"\t}\n");
  pTVar21 = local_640;
  std::operator<<(poVar6,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&data);
  counterSection.m_log._0_4_ = 5;
  std::__cxx11::string::string(local_590,(string *)&local_5f8);
  sources = glu::ProgramSources::operator<<
                      ((ProgramSources *)&decrementCounts,(ShaderSource *)&counterSection);
  glu::ShaderProgram::ShaderProgram(&program,local_630,sources);
  std::__cxx11::string::~string(local_590);
  std::__cxx11::string::~string((string *)&local_5f8);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&decrementCounts);
  OVar19 = (pAVar17->m_spec).operations;
  if (OVar19 == OPERATION_GET) {
    iVar4 = 1;
  }
  else {
    iVar4 = (OVar19 >> 1 & 2) + (OVar19 & OPERATION_INC) + (uint)((OVar19 >> 1 & 1) != 0);
  }
  iVar18 = (pAVar17->m_spec).atomicCounterCount;
  iVar12 = (pAVar17->m_spec).callCount;
  iVar28 = (pAVar17->m_spec).threadCount;
  glu::operator<<(pTVar21,&program);
  OVar2 = (local_658->m_spec).offsetType;
  if ((((OVar2 == OFFSETTYPE_INVALID) || (OVar2 == OFFSETTYPE_INVALID_DEFAULT)) ||
      (OVar2 == OFFSETTYPE_INVALID_OVERLAPPING)) ||
     ((local_658->m_spec).bindingType - BINDINGTYPE_INVALID < 2)) {
    if (program.m_program.m_info.linkOk == true) {
      ppuVar29 = &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pTVar21;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar29);
      pAVar17 = local_658;
      std::operator<<((ostream *)ppuVar29,"Expected program to fail, but compilation passed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&data,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar29);
      pcVar20 = "Compile succeeded";
      goto LAB_0042b267;
    }
    ppuVar29 = &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar21;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar29);
    pAVar17 = local_658;
    std::operator<<((ostream *)ppuVar29,"Compilation failed as expected.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&data,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar29);
    pcVar20 = "Compile failed";
    testResult = QP_TEST_RESULT_PASS;
LAB_0042b2b9:
    tcu::TestContext::setTestResult
              ((pAVar17->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,pcVar20)
    ;
    goto LAB_0042b2c2;
  }
  if (program.m_program.m_info.linkOk == false) {
    ppuVar29 = &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar21;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar29);
    std::operator<<((ostream *)ppuVar29,"Compile failed.");
    pAVar17 = local_658;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&data,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar29);
    pcVar20 = "Compile failed";
LAB_0042b267:
    testResult = QP_TEST_RESULT_FAIL;
    goto LAB_0042b2b9;
  }
  (**(code **)(local_650 + 0x1680))(program.m_program.m_program);
  dVar5 = (**(code **)(local_650 + 0x800))();
  glu::checkError(dVar5,"glUseProgram()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3b7);
  (**(code **)(local_650 + 0x40))(0x90d2,outputBuffer.super_ObjectWrapper.m_object);
  iVar18 = iVar18 * 4;
  iVar4 = iVar28 * iVar4 * iVar12 * iVar18;
  (**(code **)(local_650 + 0x150))(0x90d2,(long)iVar4,0,0x88e4);
  dVar5 = (**(code **)(local_650 + 0x800))();
  glu::checkError(dVar5,"Failed to create output buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3bc);
  decrementCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(decrementCounts.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         (local_658->m_spec).threadCount * (local_658->m_spec).callCount + 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&data,(long)(local_658->m_spec).atomicCounterCount,
             (value_type_conflict2 *)&decrementCounts,(allocator_type *)&counterSection);
  uVar14 = local_650;
  (**(code **)(local_650 + 0x40))(0x90d2,counterBuffer.super_ObjectWrapper.m_object);
  (**(code **)(uVar14 + 0x150))
            (0x90d2,(long)iVar18,
             data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  dVar5 = (**(code **)(uVar14 + 0x800))();
  glu::checkError(dVar5,"Failed to create buffer for atomic counters",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3c3);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  (**(code **)(uVar14 + 0x48))(0x90d2,1,outputBuffer.super_ObjectWrapper.m_object);
  dVar5 = (**(code **)(local_650 + 0x800))();
  glu::checkError(dVar5,"Failed to setup output buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3c8);
  (**(code **)(local_650 + 0x48))(0x92c0,1,counterBuffer.super_ObjectWrapper.m_object);
  dVar5 = (**(code **)(local_650 + 0x800))();
  glu::checkError(dVar5,"Failed to setup atomic counter buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3cc);
  (**(code **)(local_650 + 0x528))((local_658->m_spec).threadCount,1);
  dVar5 = (**(code **)(local_650 + 0x800))();
  glu::checkError(dVar5,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3d0);
  (**(code **)(local_650 + 0x648))();
  dVar5 = (**(code **)(local_650 + 0x800))();
  glu::checkError(dVar5,"glFinish()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3d3);
  data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_start._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&output,(long)(iVar4 >> 2),(value_type_conflict2 *)&data,
             (allocator_type *)&decrementCounts);
  pAVar17 = local_658;
  data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_start & 0xffffffff00000000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&counters,(long)(local_658->m_spec).atomicCounterCount,(value_type_conflict2 *)&data,
             (allocator_type *)&decrementCounts);
  uVar14 = local_650;
  (**(code **)(local_650 + 0x40))(0x90d2,outputBuffer.super_ObjectWrapper.m_object);
  dVar5 = (**(code **)(uVar14 + 0x800))();
  glu::checkError(dVar5,"glBindBuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3db);
  pvVar7 = (void *)(**(code **)(uVar14 + 0xd00))
                             (0x90d2,0,(long)output.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)output.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start,1);
  dVar5 = (**(code **)(uVar14 + 0x800))();
  glu::checkError(dVar5,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3de);
  memcpy(output.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start,pvVar7,
         ((long)output.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)output.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start) * 0x40000000 >> 0x1e);
  cVar3 = (**(code **)(uVar14 + 0x1670))(0x90d2);
  if (cVar3 == '\0') {
    dVar5 = (**(code **)(uVar14 + 0x800))();
    glu::checkError(dVar5,"glUnmapBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                    ,0x3e4);
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Mapped buffer corrupted","false",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
               ,0x3e5);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(uVar14 + 0x40))(0x90d2,0);
  dVar5 = (**(code **)(uVar14 + 0x800))();
  glu::checkError(dVar5,"glBindBuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3e9);
  (**(code **)(uVar14 + 0x40))(0x90d2,counterBuffer.super_ObjectWrapper.m_object);
  dVar5 = (**(code **)(uVar14 + 0x800))();
  glu::checkError(dVar5,"glBindBuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3ef);
  pvVar7 = (void *)(**(code **)(uVar14 + 0xd00))
                             (0x90d2,0,(long)counters.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)counters.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start,1);
  dVar5 = (**(code **)(uVar14 + 0x800))();
  glu::checkError(dVar5,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3f2);
  memcpy(counters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start,pvVar7,
         ((long)counters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)counters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start) * 0x40000000 >> 0x1e);
  cVar3 = (**(code **)(uVar14 + 0x1670))(0x90d2);
  if (cVar3 == '\0') {
    dVar5 = (**(code **)(uVar14 + 0x800))();
    glu::checkError(dVar5,"glUnmapBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                    ,0x3f8);
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Mapped buffer corrupted","false",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
               ,0x3f9);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(uVar14 + 0x40))(0x90d2,0);
  dVar5 = (**(code **)(uVar14 + 0x800))();
  glu::checkError(dVar5,"glBindBuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                  ,0x3fd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"Counter info",(allocator<char> *)&local_5f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&decrementCounts,
             "Show initial value, current value and expected value of each counter.",
             (allocator<char> *)&local_4f8);
  tcu::ScopedLogSection::ScopedLogSection
            (&counterSection,pTVar21,(string *)&data,(string *)&decrementCounts);
  std::__cxx11::string::~string((string *)&decrementCounts);
  std::__cxx11::string::~string((string *)&data);
  local_641 = 1;
  ppuVar29 = &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  for (lVar27 = 0;
      lVar27 < (int)((ulong)((long)counters.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)counters.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
      lVar27 = lVar27 + 1) {
    uVar9 = counters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar27];
    iVar4 = (pAVar17->m_spec).threadCount * (pAVar17->m_spec).callCount;
    uVar26 = iVar4 + 1;
    OVar19 = (pAVar17->m_spec).operations & (OPERATION_DEC|OPERATION_INC);
    uVar13 = 0xffffffff;
    switch(OVar19) {
    case OPERATION_INC:
      if ((local_658->m_spec).useBranches == true) {
        iVar4 = iVar4 / -2 + iVar4;
      }
      uVar13 = iVar4 + uVar26;
      break;
    case OPERATION_DEC:
      if ((local_658->m_spec).useBranches == true) {
        iVar4 = iVar4 / -2 + iVar4;
      }
      uVar13 = uVar26 - iVar4;
      break;
    case OPERATION_DEC|OPERATION_INC:
      iVar18 = 0;
      if ((local_658->m_spec).useBranches == true) {
        iVar18 = iVar4 / -2;
        uVar26 = iVar4 + uVar26 + iVar18;
      }
      uVar13 = uVar26 + iVar18;
      goto LAB_0042b876;
    }
    if (OVar19 == 0) {
      uVar13 = uVar26;
    }
LAB_0042b876:
    data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_640;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar29);
    std::operator<<((ostream *)ppuVar29,"atomic_uint counter");
    std::ostream::operator<<(ppuVar29,(int)lVar27);
    std::operator<<((ostream *)ppuVar29," initial value: ");
    std::ostream::_M_insert<unsigned_long>((ulong)ppuVar29);
    std::operator<<((ostream *)ppuVar29,", value: ");
    std::ostream::_M_insert<unsigned_long>((ulong)ppuVar29);
    std::operator<<((ostream *)ppuVar29,", expected: ");
    std::ostream::_M_insert<unsigned_long>((ulong)ppuVar29);
    pcVar20 = ", failed!";
    if (uVar9 == uVar13) {
      pcVar20 = SSBOArrayLengthTests::init::arraysSized + 1;
    }
    std::operator<<((ostream *)ppuVar29,pcVar20);
    pTVar21 = (TestLog *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&data,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar29);
    local_641 = local_641 & uVar9 == uVar13;
    pAVar17 = local_658;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&counterSection);
  increments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  increments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  increments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  decrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  decrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  decrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  preGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  preGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  preGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  postGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  postGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  postGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  gets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  gets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar26 = (pAVar17->m_spec).callCount;
  uVar14 = (ulong)uVar26;
  iVar4 = (pAVar17->m_spec).threadCount;
  iVar18 = (pAVar17->m_spec).atomicCounterCount;
  OVar19 = (pAVar17->m_spec).operations;
  local_624 = (undefined4)CONCAT71((int7)((ulong)pTVar21 >> 8),1);
  uVar9 = 0xffffffff;
  if ((OVar19 == OPERATION_GET) || (6 < OVar19 - OPERATION_INC)) {
switchD_0042cfd9_caseD_4:
    local_630 = (RenderContext *)0xffffffff;
    local_650 = 0xffffffffffffffff;
    uVar26 = uVar9;
    goto LAB_0042ba3d;
  }
  uVar13 = iVar4 * uVar26 * iVar18;
  local_650 = (ulong)uVar13;
  uVar26 = 0;
  switch(OVar19) {
  case OPERATION_INC:
    local_650 = 0xffffffffffffffff;
    local_630 = (RenderContext *)0xffffffffffffffff;
    uVar26 = 0;
    break;
  case OPERATION_DEC:
    local_630 = (RenderContext *)0xffffffff;
    local_650 = 0;
    uVar26 = uVar9;
    break;
  case OPERATION_DEC|OPERATION_INC:
    local_630 = (RenderContext *)0xffffffffffffffff;
    break;
  case OPERATION_GET:
    goto switchD_0042cfd9_caseD_4;
  case OPERATION_GET|OPERATION_INC:
    local_650 = 0xffffffffffffffff;
    uVar26 = uVar13 * 2;
    goto LAB_0042d021;
  case OPERATION_GET|OPERATION_DEC:
    local_630 = (RenderContext *)(ulong)(uVar13 * 2);
    local_624 = 0;
    uVar26 = uVar9;
    break;
  case OPERATION_GET|OPERATION_DEC|OPERATION_INC:
    local_650 = (ulong)(uVar13 * 2);
    uVar26 = uVar13 * 3;
LAB_0042d021:
    local_630 = (RenderContext *)(ulong)uVar26;
    local_624 = 0;
    uVar26 = uVar13;
  }
LAB_0042ba3d:
  for (iVar12 = 0; iVar12 < iVar4; iVar12 = iVar12 + 1) {
    for (iVar4 = 0; iVar4 < (int)uVar14; iVar4 = iVar4 + 1) {
      for (iVar28 = 0; iVar28 < iVar18; iVar28 = iVar28 + 1) {
        iVar18 = iVar18 * ((pAVar17->m_spec).callCount * iVar12 + iVar4);
        if (uVar26 != 0xffffffff) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&increments,
                     output.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + (int)(uVar26 + iVar28 + iVar18));
        }
        if ((uint)local_650 != -1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&decrements,
                     output.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + (int)((uint)local_650 + iVar28 + iVar18));
        }
        if ((char)local_624 == '\0') {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&preGets,output.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_start + (iVar18 + iVar28));
        }
        if ((int)local_630 != -1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&postGets,
                     output.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + (iVar18 + (int)local_630 + iVar28));
        }
        if (OVar19 == OPERATION_GET) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&gets,output.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start + (iVar18 + iVar28));
        }
        iVar18 = (local_658->m_spec).atomicCounterCount;
        pAVar17 = local_658;
      }
      uVar14 = (ulong)(uint)(pAVar17->m_spec).callCount;
    }
    iVar4 = (pAVar17->m_spec).threadCount;
  }
  local_650 = CONCAT44(local_650._4_4_,(int)CONCAT71((int7)(uVar14 >> 8),1));
  local_65c = 0;
  while( true ) {
    ppuVar29 = &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    if (iVar18 <= local_65c) break;
    counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    counterDecrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    counterDecrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    counterDecrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    counterPreGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    counterPreGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    counterPreGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    counterPostGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    counterPostGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    counterPostGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    counterGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    counterGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    counterGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    getCountersValues(&counterIncrements,&increments,local_65c,iVar18);
    getCountersValues(&counterDecrements,&decrements,local_65c,(pAVar17->m_spec).atomicCounterCount)
    ;
    getCountersValues(&counterPreGets,&preGets,local_65c,(pAVar17->m_spec).atomicCounterCount);
    getCountersValues(&counterPostGets,&postGets,local_65c,(pAVar17->m_spec).atomicCounterCount);
    getCountersValues(&counterGets,&gets,local_65c,(pAVar17->m_spec).atomicCounterCount);
    OVar19 = (pAVar17->m_spec).operations;
    if (OVar19 == OPERATION_GET) {
      de::toString<int>(&local_5f8,&local_65c);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &counterSection,"counter",&local_5f8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &decrementCounts,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &counterSection," value check");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&data,
                 (char *)decrementCounts.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,(allocator<char> *)&local_488);
      de::toString<int>(&local_5d8,&local_65c);
      std::operator+(&local_570,"Check that counter",&local_5d8);
      std::operator+(&local_618,&local_570," values haven\'t changed.");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4f8,local_618._M_dataplus._M_p,(allocator<char> *)&local_4a8);
      tcu::ScopedLogSection::ScopedLogSection(&valueCheck,local_640,(string *)&data,&local_4f8);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::__cxx11::string::~string((string *)&local_618);
      std::__cxx11::string::~string((string *)&local_570);
      std::__cxx11::string::~string((string *)&local_5d8);
      std::__cxx11::string::~string((string *)&data);
      std::__cxx11::string::~string((string *)&decrementCounts);
      std::__cxx11::string::~string((string *)&counterSection);
      std::__cxx11::string::~string((string *)&local_5f8);
      lVar30 = 0;
      iVar4 = 0;
      for (lVar27 = 0; pAVar17 = local_658,
          lVar27 < (int)((ulong)((long)gets.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)gets.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2);
          lVar27 = lVar27 + 1) {
        if ((((local_658->m_spec).useBranches &
             *(int *)((long)gets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar30) == -1) == 0) &&
           (*(int *)((long)gets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar30) !=
            (local_658->m_spec).threadCount * (local_658->m_spec).callCount + 1)) {
          if (iVar4 < 0x14) {
            data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_640;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar29);
            std::operator<<((ostream *)ppuVar29,"atomicCounter(counter");
            std::ostream::operator<<(ppuVar29,local_65c);
            std::operator<<((ostream *)ppuVar29,") returned ");
            this_00 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)&data,
                                 (uint *)((long)gets.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start + lVar30))
            ;
            std::operator<<((ostream *)&this_00->m_str," expected ");
            std::ostream::_M_insert<unsigned_long>((ulong)&this_00->m_str);
            tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar29);
          }
          iVar4 = iVar4 + 1;
          local_650 = local_650 & 0xffffffff00000000;
        }
        lVar30 = lVar30 + 4;
      }
      if (iVar4 == 0) {
        data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_640;
        ppuVar29 = &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar29);
        pAVar17 = local_658;
        std::operator<<((ostream *)ppuVar29,"All values returned by atomicCounter(counter");
        std::ostream::operator<<(ppuVar29,local_65c);
        std::operator<<((ostream *)ppuVar29,") match initial value ");
        std::ostream::_M_insert<unsigned_long>((ulong)ppuVar29);
        std::operator<<((ostream *)
                        &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,".");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&data,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0042c624:
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)
                   &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
      }
      else if (0x14 < iVar4) {
        data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_640;
        ppuVar29 = &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar29);
        std::operator<<((ostream *)ppuVar29,
                        "Total number of invalid values returned by atomicCounter(counter");
        std::ostream::operator<<(ppuVar29,local_65c);
        std::operator<<((ostream *)ppuVar29,") ");
        std::ostream::operator<<(ppuVar29,iVar4);
        std::operator<<((ostream *)ppuVar29," displaying first 20 values.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&data,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_0042c624;
      }
LAB_0042c854:
      this_01 = &valueCheck;
LAB_0042c85c:
      tcu::ScopedLogSection::~ScopedLogSection(this_01);
    }
    else {
      if ((~OVar19 & 3) == 0) {
        de::toString<int>(&local_5f8,&local_65c);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &counterSection,"counter",&local_5f8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &decrementCounts,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &counterSection," path check");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&data,
                   (char *)decrementCounts.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,(allocator<char> *)&local_488);
        de::toString<int>(&local_5d8,&local_65c);
        std::operator+(&local_570,"Check that there is order in which counter",&local_5d8);
        std::operator+(&local_618,&local_570," increments and decrements could have happened.");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4f8,local_618._M_dataplus._M_p,(allocator<char> *)&local_4a8);
        tcu::ScopedLogSection::ScopedLogSection(&valueCheck,local_640,(string *)&data,&local_4f8);
        std::__cxx11::string::~string((string *)&local_4f8);
        std::__cxx11::string::~string((string *)&local_618);
        std::__cxx11::string::~string((string *)&local_570);
        std::__cxx11::string::~string((string *)&local_5d8);
        std::__cxx11::string::~string((string *)&data);
        std::__cxx11::string::~string((string *)&decrementCounts);
        std::__cxx11::string::~string((string *)&counterSection);
        std::__cxx11::string::~string((string *)&local_5f8);
        iVar18 = (pAVar17->m_spec).threadCount * (pAVar17->m_spec).callCount;
        uVar26 = iVar18 + 1;
        uVar14 = 0;
        iVar4 = 0;
        uVar9 = uVar26;
        if ((pAVar17->m_spec).useBranches == true) {
          iVar4 = iVar18 / -2;
          uVar9 = iVar18 + uVar26 + iVar4;
        }
        data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        decrementCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        decrementCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        decrementCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar10 = (ulong)((long)counterIncrements.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)counterIncrements.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2;
        uVar11 = uVar10 & 0xffffffff;
        if ((int)uVar10 < 1) {
          uVar11 = uVar14;
        }
        uVar13 = 0xffffffff;
        for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
          uVar16 = counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10];
          uVar22 = uVar13;
          if (uVar16 < uVar13) {
            uVar22 = uVar16;
          }
          uVar24 = (ulong)uVar16;
          if (uVar16 < (uint)uVar14) {
            uVar24 = uVar14;
          }
          if (uVar16 != 0xffffffff) {
            uVar13 = uVar22;
            uVar14 = uVar24;
          }
        }
        uVar11 = (ulong)((long)counterDecrements.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)counterDecrements.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2;
        uVar10 = uVar11 & 0xffffffff;
        if ((int)uVar11 < 1) {
          uVar10 = 0;
        }
        for (uVar11 = 0; uVar16 = (uint)uVar14, uVar10 != uVar11; uVar11 = uVar11 + 1) {
          uVar22 = counterDecrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11];
          uVar23 = uVar13;
          if (uVar22 < uVar13) {
            uVar23 = uVar22;
          }
          uVar24 = (ulong)uVar22;
          if (uVar22 < uVar16) {
            uVar24 = uVar14;
          }
          if (uVar22 != 0xffffffff) {
            uVar13 = uVar23;
            uVar14 = uVar24;
          }
        }
        if (uVar26 <= uVar13) {
          uVar13 = uVar26;
        }
        if (uVar16 <= uVar26) {
          uVar16 = uVar26;
        }
        uVar14 = (ulong)((uVar16 - uVar13) + 1);
        counterSection.m_log._0_4_ = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (&data,uVar14,(value_type_conflict2 *)&counterSection);
        counterSection.m_log._0_4_ = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (&decrementCounts,uVar14,(value_type_conflict2 *)&counterSection);
        pAVar17 = local_658;
        uVar14 = (ulong)((long)counterIncrements.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)counterIncrements.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2;
        uVar11 = uVar14 & 0xffffffff;
        if ((int)uVar14 < 1) {
          uVar11 = 0;
        }
        for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
          if (counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar14] != 0xffffffff) {
            data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start
            [counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar14] - uVar13] =
                 data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar14] - uVar13] + 1;
          }
        }
        uVar14 = (ulong)((long)counterDecrements.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)counterDecrements.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2;
        uVar11 = uVar14 & 0xffffffff;
        if ((int)uVar14 < 1) {
          uVar11 = 0;
        }
        for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
          if (counterDecrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar14] != 0xffffffff) {
            decrementCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start
            [counterDecrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar14] - uVar13] =
                 decrementCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [counterDecrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar14] - uVar13] + 1;
          }
        }
        iVar18 = uVar26 - uVar13;
        uVar14 = (ulong)((long)data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2;
        while( true ) {
          uVar26 = data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar18];
          uVar16 = decrementCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar18];
          iVar12 = (int)uVar14;
          if (uVar26 + uVar16 == 0) break;
          puVar25 = decrementCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start + iVar18;
          if (uVar26 == 0) {
            iVar28 = -1;
            if (uVar16 != 0) goto LAB_0042c48c;
          }
          else {
            if (((int)((iVar4 + uVar9) - uVar13) <= iVar18) || (iVar28 = -1, uVar16 == 0)) {
              iVar28 = 1;
              puVar25 = data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_start + iVar18;
              uVar16 = uVar26;
            }
LAB_0042c48c:
            *puVar25 = uVar16 - 1;
            iVar18 = iVar18 + iVar28;
          }
          if ((iVar18 < 0) || (iVar12 <= iVar18)) break;
        }
        bVar31 = iVar18 + uVar13 == iVar4 + uVar9;
        uVar14 = uVar14 & 0xffffffff;
        if (iVar12 < 1) {
          uVar14 = 0;
        }
        ppuVar29 = &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
          bVar31 = (bool)(bVar31 & data.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar11] == 0);
        }
        uVar14 = (ulong)((long)decrementCounts.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)decrementCounts.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2;
        uVar11 = uVar14 & 0xffffffff;
        if ((int)uVar14 < 1) {
          uVar11 = 0;
        }
        for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
          bVar31 = (bool)(bVar31 & decrementCounts.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar14] == 0);
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&decrementCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
        ;
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&data);
        if (!bVar31) {
          data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_640;
          ppuVar29 = &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar29);
          std::operator<<((ostream *)ppuVar29,
                          "No possible order of calls to atomicCounterIncrement(counter");
          std::ostream::operator<<(ppuVar29,local_65c);
          std::operator<<((ostream *)ppuVar29,") and atomicCounterDecrement(counter");
          std::ostream::operator<<(ppuVar29,local_65c);
          std::operator<<((ostream *)ppuVar29,") found.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&data,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar29);
          local_650 = local_650 & 0xffffffff00000000;
          goto LAB_0042c854;
        }
        data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_640;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar29);
        std::operator<<((ostream *)ppuVar29,
                        "Found possible order of calls to atomicCounterIncrement(counter");
        std::ostream::operator<<(ppuVar29,local_65c);
        std::operator<<((ostream *)ppuVar29,") and atomicCounterDecrement(counter");
        std::ostream::operator<<(ppuVar29,local_65c);
        std::operator<<((ostream *)ppuVar29,").");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&data,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_0042c624;
      }
      if ((OVar19 & OPERATION_INC) != 0) {
        de::toString<int>(&local_5f8,&local_65c);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &counterSection,"counter",&local_5f8);
        ppuVar29 = &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &decrementCounts,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &counterSection," check uniqueness and linearity");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&data,
                   (char *)decrementCounts.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,(allocator<char> *)&local_488);
        de::toString<int>(&local_5d8,&local_65c);
        std::operator+(&local_570,"Check that counter",&local_5d8);
        std::operator+(&local_618,&local_570," returned only unique and linear values.");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4f8,local_618._M_dataplus._M_p,(allocator<char> *)&local_4a8);
        pTVar21 = local_640;
        tcu::ScopedLogSection::ScopedLogSection(&valueCheck,local_640,(string *)&data,&local_4f8);
        std::__cxx11::string::~string((string *)&local_4f8);
        std::__cxx11::string::~string((string *)&local_618);
        std::__cxx11::string::~string((string *)&local_570);
        std::__cxx11::string::~string((string *)&local_5d8);
        std::__cxx11::string::~string((string *)&data);
        std::__cxx11::string::~string((string *)&decrementCounts);
        std::__cxx11::string::~string((string *)&counterSection);
        std::__cxx11::string::~string((string *)&local_5f8);
        bVar31 = checkUniquenessAndLinearity(pTVar21,&counterIncrements);
        if (bVar31) {
          data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_640;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar29);
          std::operator<<((ostream *)ppuVar29,"atomicCounterIncrement(counter");
          std::ostream::operator<<(ppuVar29,local_65c);
          std::operator<<((ostream *)ppuVar29,") returned only unique values.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&data,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar29);
          uVar26 = (uint)local_650;
        }
        else {
          data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_640;
          ppuVar29 = &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar29);
          std::operator<<((ostream *)ppuVar29,"atomicCounterIncrement(counter");
          std::ostream::operator<<(ppuVar29,local_65c);
          std::operator<<((ostream *)ppuVar29,") returned non unique values.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&data,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar29);
          uVar26 = 0;
        }
        tcu::ScopedLogSection::~ScopedLogSection(&valueCheck);
        local_650 = CONCAT44(local_650._4_4_,uVar26);
        if (((uVar26 & 1) == 0) || (((pAVar17->m_spec).operations & OPERATION_GET) == 0))
        goto LAB_0042c861;
        de::toString<int>(&local_5f8,&local_65c);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &counterSection,"counter",&local_5f8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &decrementCounts,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &counterSection," check range");
        ppuVar29 = &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&data,
                   (char *)decrementCounts.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,&local_631);
        de::toString<int>(&local_488,&local_65c);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &valueCheck,"Check that counter",&local_488);
        std::operator+(&local_5d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &valueCheck,
                       " returned only values values between previous and next atomicCounter(counter"
                      );
        de::toString<int>(&local_4a8,&local_65c);
        std::operator+(&local_570,&local_5d8,&local_4a8);
        std::operator+(&local_618,&local_570,").");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4f8,local_618._M_dataplus._M_p,&local_632);
        pTVar21 = local_640;
        tcu::ScopedLogSection::ScopedLogSection
                  (&uniquenesCheck_1,local_640,(string *)&data,&local_4f8);
        std::__cxx11::string::~string((string *)&local_4f8);
        std::__cxx11::string::~string((string *)&local_618);
        std::__cxx11::string::~string((string *)&local_570);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::__cxx11::string::~string((string *)&local_5d8);
        std::__cxx11::string::~string((string *)&valueCheck);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&data);
        std::__cxx11::string::~string((string *)&decrementCounts);
        std::__cxx11::string::~string((string *)&counterSection);
        std::__cxx11::string::~string((string *)&local_5f8);
        bVar31 = checkRange(pTVar21,&counterIncrements,&counterPreGets,&counterPostGets);
        if (bVar31) {
          data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_640;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar29);
          std::operator<<((ostream *)ppuVar29,"atomicCounterIncrement(counter");
          std::ostream::operator<<(ppuVar29,local_65c);
          std::operator<<((ostream *)ppuVar29,
                          ") returned only values between previous and next call to atomicCounter(counter"
                         );
          std::ostream::operator<<(ppuVar29,local_65c);
          std::operator<<((ostream *)ppuVar29,").");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&data,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_0042ce18;
        }
        data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_640;
        ppuVar29 = &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar29);
        std::operator<<((ostream *)ppuVar29,"atomicCounterIncrement(counter");
        std::ostream::operator<<(ppuVar29,local_65c);
        std::operator<<((ostream *)ppuVar29,
                        ") returned value that is not between previous and next call to atomicCounter(counter"
                       );
        std::ostream::operator<<(ppuVar29,local_65c);
        std::operator<<((ostream *)ppuVar29,").");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&data,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0042cf09:
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)
                   &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        local_650 = local_650 & 0xffffffff00000000;
LAB_0042cf19:
        this_01 = &uniquenesCheck_1;
        goto LAB_0042c85c;
      }
      if ((OVar19 & OPERATION_DEC) != 0) {
        de::toString<int>(&local_5f8,&local_65c);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &counterSection,"counter",&local_5f8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &decrementCounts,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &counterSection," check uniqueness and linearity");
        ppuVar29 = &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&data,
                   (char *)decrementCounts.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,(allocator<char> *)&local_488);
        de::toString<int>(&local_5d8,&local_65c);
        std::operator+(&local_570,"Check that counter",&local_5d8);
        std::operator+(&local_618,&local_570," returned only unique and linear values.");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4f8,local_618._M_dataplus._M_p,(allocator<char> *)&local_4a8);
        pTVar21 = local_640;
        tcu::ScopedLogSection::ScopedLogSection(&valueCheck,local_640,(string *)&data,&local_4f8);
        std::__cxx11::string::~string((string *)&local_4f8);
        std::__cxx11::string::~string((string *)&local_618);
        std::__cxx11::string::~string((string *)&local_570);
        std::__cxx11::string::~string((string *)&local_5d8);
        std::__cxx11::string::~string((string *)&data);
        std::__cxx11::string::~string((string *)&decrementCounts);
        std::__cxx11::string::~string((string *)&counterSection);
        std::__cxx11::string::~string((string *)&local_5f8);
        bVar31 = checkUniquenessAndLinearity(pTVar21,&counterDecrements);
        if (bVar31) {
          data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_640;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar29);
          std::operator<<((ostream *)ppuVar29,"atomicCounterDecrement(counter");
          std::ostream::operator<<(ppuVar29,local_65c);
          std::operator<<((ostream *)ppuVar29,") returned only unique values.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&data,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar29);
          uVar26 = (uint)local_650;
        }
        else {
          data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_640;
          ppuVar29 = &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar29);
          std::operator<<((ostream *)ppuVar29,"atomicCounterDecrement(counter");
          std::ostream::operator<<(ppuVar29,local_65c);
          std::operator<<((ostream *)ppuVar29,") returned non unique values.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&data,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar29);
          uVar26 = 0;
        }
        tcu::ScopedLogSection::~ScopedLogSection(&valueCheck);
        local_650 = CONCAT44(local_650._4_4_,uVar26);
        if (((uVar26 & 1) != 0) && (((pAVar17->m_spec).operations & OPERATION_GET) != 0)) {
          de::toString<int>(&local_5f8,&local_65c);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &counterSection,"counter",&local_5f8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &decrementCounts,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &counterSection," check range");
          ppuVar29 = &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&data,
                     (char *)decrementCounts.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start,&local_631);
          de::toString<int>(&local_488,&local_65c);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &valueCheck,"Check that counter",&local_488);
          std::operator+(&local_5d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &valueCheck,
                         " returned only values values between previous and next atomicCounter(counter"
                        );
          de::toString<int>(&local_4a8,&local_65c);
          std::operator+(&local_570,&local_5d8,&local_4a8);
          std::operator+(&local_618,&local_570,".");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4f8,local_618._M_dataplus._M_p,&local_632);
          pTVar21 = local_640;
          tcu::ScopedLogSection::ScopedLogSection
                    (&uniquenesCheck_1,local_640,(string *)&data,&local_4f8);
          std::__cxx11::string::~string((string *)&local_4f8);
          std::__cxx11::string::~string((string *)&local_618);
          std::__cxx11::string::~string((string *)&local_570);
          std::__cxx11::string::~string((string *)&local_4a8);
          std::__cxx11::string::~string((string *)&local_5d8);
          std::__cxx11::string::~string((string *)&valueCheck);
          std::__cxx11::string::~string((string *)&local_488);
          std::__cxx11::string::~string((string *)&data);
          std::__cxx11::string::~string((string *)&decrementCounts);
          std::__cxx11::string::~string((string *)&counterSection);
          std::__cxx11::string::~string((string *)&local_5f8);
          bVar31 = checkRange(pTVar21,&counterDecrements,&counterPostGets,&counterPreGets);
          if (!bVar31) {
            data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_640;
            ppuVar29 = &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_finish;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar29);
            std::operator<<((ostream *)ppuVar29,"atomicCounterDecrement(counter");
            std::ostream::operator<<(ppuVar29,local_65c);
            std::operator<<((ostream *)ppuVar29,
                            ") returned value that is not between previous and next call to atomicCounter(counter"
                           );
            std::ostream::operator<<(ppuVar29,local_65c);
            std::operator<<((ostream *)ppuVar29,").");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&data,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_0042cf09;
          }
          data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_640;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar29);
          std::operator<<((ostream *)ppuVar29,"atomicCounterDecrement(counter");
          std::ostream::operator<<(ppuVar29,local_65c);
          std::operator<<((ostream *)ppuVar29,
                          ") returned only values between previous and next call to atomicCounter(counter"
                         );
          std::ostream::operator<<(ppuVar29,local_65c);
          std::operator<<((ostream *)ppuVar29,").");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&data,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0042ce18:
          std::__cxx11::ostringstream::~ostringstream
                    ((ostringstream *)
                     &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
          goto LAB_0042cf19;
        }
      }
    }
LAB_0042c861:
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&counterGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&counterPostGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&counterPreGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&counterDecrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    local_65c = local_65c + 1;
    iVar18 = (pAVar17->m_spec).atomicCounterCount;
  }
  bVar15 = (byte)local_650 & local_641;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&gets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&postGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&preGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&decrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&increments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  pcVar20 = "Fail";
  if ((bVar15 & 1) != 0) {
    pcVar20 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((pAVar17->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~bVar15 & QP_TEST_RESULT_FAIL,pcVar20);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&counters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&output.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
LAB_0042b2c2:
  glu::ShaderProgram::~ShaderProgram(&program);
  glu::ObjectWrapper::~ObjectWrapper(&outputBuffer.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&counterBuffer.super_ObjectWrapper);
  return STOP;
}

Assistant:

TestCase::IterateResult AtomicCounterTest::iterate (void)
{
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
	TestLog&					log					= m_testCtx.getLog();
	const glu::Buffer			counterBuffer		(m_context.getRenderContext());
	const glu::Buffer			outputBuffer		(m_context.getRenderContext());
	const glu::ShaderProgram	program				(m_context.getRenderContext(), glu::ProgramSources() << glu::ShaderSource(glu::SHADERTYPE_COMPUTE, generateShaderSource(m_spec)));

	const deInt32				counterBufferSize	= m_spec.atomicCounterCount * 4;
	const deInt32				ssoSize				= m_spec.atomicCounterCount * m_spec.callCount * m_spec.threadCount * 4 * getOperationCount();

	log << program;

	if (m_spec.offsetType == OFFSETTYPE_INVALID || m_spec.offsetType == OFFSETTYPE_INVALID_DEFAULT || m_spec.bindingType == BINDINGTYPE_INVALID || m_spec.bindingType == BINDINGTYPE_INVALID_DEFAULT || m_spec.offsetType == OFFSETTYPE_INVALID_OVERLAPPING)
	{
		if (program.isOk())
		{
			log << TestLog::Message << "Expected program to fail, but compilation passed." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile succeeded");
			return STOP;
		}
		else
		{
			log << TestLog::Message << "Compilation failed as expected." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Compile failed");
			return STOP;
		}
	}
	else if (!program.isOk())
	{
		log << TestLog::Message << "Compile failed." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	gl.useProgram(program.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram()");

	// Create output buffer
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, ssoSize, NULL, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create output buffer");

	// Create atomic counter buffer
	{
		vector<deUint32> data(m_spec.atomicCounterCount, getInitialValue());
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *counterBuffer);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, counterBufferSize, &(data[0]), GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create buffer for atomic counters");
	}

	// Bind output buffer
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, *outputBuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup output buffer");

	// Bind atomic counter buffer
	gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 1, *counterBuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup atomic counter buffer");

	// Dispath compute
	gl.dispatchCompute(m_spec.threadCount, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

	gl.finish();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish()");

	vector<deUint32> output(ssoSize/4, 0);
	vector<deUint32> counters(m_spec.atomicCounterCount, 0);

	// Read back output buffer
	{
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");

		void* ptr = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(output.size() * sizeof(deUint32)), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");

		deMemcpy(&(output[0]), ptr, (int)output.size() * sizeof(deUint32));

		if (!gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER))
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");
			TCU_CHECK_MSG(false, "Mapped buffer corrupted");
		}

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");
	}

	// Read back counter buffer
	{
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *counterBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");

		void* ptr = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(counters.size() * sizeof(deUint32)), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");

		deMemcpy(&(counters[0]), ptr, (int)counters.size() * sizeof(deUint32));

		if (!gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER))
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");
			TCU_CHECK_MSG(false, "Mapped buffer corrupted");
		}

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");
	}

	bool isOk = true;

	if (!checkAndLogCounterValues(log, counters))
		isOk = false;

	{
		vector<deUint32> increments;
		vector<deUint32> decrements;
		vector<deUint32> preGets;
		vector<deUint32> postGets;
		vector<deUint32> gets;

		splitBuffer(output, increments, decrements, preGets, postGets, gets);

		if (!checkAndLogCallValues(log, increments, decrements, preGets, postGets, gets))
			isOk = false;
	}

	if (isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

	return STOP;
}